

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

void __thiscall
helics::HandleManager::setHandleOption
          (HandleManager *this,InterfaceHandle handle,int32_t option,int32_t val)

{
  bool bVar1;
  reference pvVar2;
  int in_ECX;
  deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *this_00;
  int in_EDX;
  BaseType index;
  deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
  *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  int testSize;
  InterfaceHandle local_4;
  
  testSize = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  InterfaceHandle::baseValue(&local_4);
  bVar1 = isValidIndex<int,std::deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>>>
                    (testSize,in_stack_ffffffffffffffc8);
  if (bVar1) {
    this_00 = (deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *)
              (ulong)(in_EDX - 0x18d);
    switch(this_00) {
    case (deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *)0x0:
      if (in_ECX == 0) {
        pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
                 operator[](this_00,(size_type)in_stack_ffffffffffffffc8);
        clearActionFlag<helics::BasicHandleInfo,helics::InterfaceFlags>(pvVar2,required_flag);
      }
      else {
        pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
                 operator[](this_00,(size_type)in_stack_ffffffffffffffc8);
        clearActionFlag<helics::BasicHandleInfo,helics::InterfaceFlags>(pvVar2,optional_flag);
        pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
                 operator[](this_00,(size_type)in_stack_ffffffffffffffc8);
        setActionFlag<helics::BasicHandleInfo,helics::InterfaceFlags>(pvVar2,required_flag);
      }
      break;
    default:
      break;
    case (deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *)0x5:
      if (in_ECX == 0) {
        pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
                 operator[](this_00,(size_type)in_stack_ffffffffffffffc8);
        clearActionFlag<helics::BasicHandleInfo,helics::InterfaceFlags>(pvVar2,optional_flag);
      }
      else {
        pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
                 operator[](this_00,(size_type)in_stack_ffffffffffffffc8);
        clearActionFlag<helics::BasicHandleInfo,helics::InterfaceFlags>(pvVar2,required_flag);
        pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
                 operator[](this_00,(size_type)in_stack_ffffffffffffffc8);
        setActionFlag<helics::BasicHandleInfo,helics::InterfaceFlags>(pvVar2,optional_flag);
      }
      break;
    case (deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *)0xf:
      if (in_ECX == 0) {
        pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
                 operator[](this_00,(size_type)in_stack_ffffffffffffffc8);
        clearActionFlag<helics::BasicHandleInfo,helics::InterfaceFlags>(pvVar2,reconnectable_flag);
      }
      else {
        pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
                 operator[](this_00,(size_type)in_stack_ffffffffffffffc8);
        setActionFlag<helics::BasicHandleInfo,helics::InterfaceFlags>(pvVar2,reconnectable_flag);
      }
      break;
    case (deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_> *)0x19:
      pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
               operator[](this_00,(size_type)in_stack_ffffffffffffffc8);
      if (pvVar2->handleType == ENDPOINT) {
        if (in_ECX == 0) {
          pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
                   operator[](this_00,(size_type)in_stack_ffffffffffffffc8);
          clearActionFlag<helics::BasicHandleInfo,helics::EndpointFlags>(pvVar2,receive_only_flag);
        }
        else {
          pvVar2 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::
                   operator[](this_00,(size_type)in_stack_ffffffffffffffc8);
          setActionFlag<helics::BasicHandleInfo,helics::EndpointFlags>(pvVar2,receive_only_flag);
        }
      }
    }
  }
  return;
}

Assistant:

void HandleManager::setHandleOption(InterfaceHandle handle, int32_t option, int32_t val)
{
    auto index = handle.baseValue();
    if (isValidIndex(index, handles)) {
        switch (option) {
            case HELICS_HANDLE_OPTION_CONNECTION_REQUIRED:
                if (val != 0) {
                    clearActionFlag(handles[index], optional_flag);
                    setActionFlag(handles[index], required_flag);
                } else {
                    clearActionFlag(handles[index], required_flag);
                }
                break;
            case HELICS_HANDLE_OPTION_CONNECTION_OPTIONAL:
                if (val != 0) {
                    clearActionFlag(handles[index], required_flag);
                    setActionFlag(handles[index], optional_flag);
                } else {
                    clearActionFlag(handles[index], optional_flag);
                }
                break;
            case HELICS_HANDLE_OPTION_RECEIVE_ONLY:
                if (handles[index].handleType == InterfaceType::ENDPOINT) {
                    if (val != 0) {
                        setActionFlag(handles[index], receive_only_flag);
                    } else {
                        clearActionFlag(handles[index], receive_only_flag);
                    }
                }
                break;
            case HELICS_HANDLE_OPTION_RECONNECTABLE:
                if (val != 0) {
                    setActionFlag(handles[index], reconnectable_flag);
                } else {
                    clearActionFlag(handles[index], reconnectable_flag);
                }
                break;
            default:
                break;
        }
    }
}